

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

string_view __thiscall choc::value::ValueView::getString(ValueView *this)

{
  StringDictionary *pSVar1;
  string_view sVar2;
  Handle HVar3;
  int iVar4;
  undefined4 extraout_var;
  char *extraout_RDX;
  ValueView *this_local;
  
  check(this->stringDictionary != (StringDictionary *)0x0,"No string dictionary supplied");
  pSVar1 = this->stringDictionary;
  HVar3 = getStringHandle(this);
  iVar4 = (*pSVar1->_vptr_StringDictionary[3])(pSVar1,(ulong)HVar3.handle);
  sVar2._M_len._4_4_ = extraout_var;
  sVar2._M_len._0_4_ = iVar4;
  sVar2._M_str = extraout_RDX;
  return sVar2;
}

Assistant:

inline std::string_view ValueView::getString() const
{
    check (stringDictionary != nullptr, "No string dictionary supplied");
    return stringDictionary->getStringForHandle (getStringHandle());
}